

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::extract_global_variables_from_function
          (CompilerMSL *this,uint32_t func_id,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *added_arg_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *global_var_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  uint16_t uVar1;
  StorageClass SVar2;
  Decoration *pDVar3;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var4;
  bool bVar5;
  uint32_t uVar6;
  ExecutionModel EVar7;
  ID IVar8;
  iterator iVar9;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var10;
  SPIRBlock *pSVar11;
  uint32_t *puVar12;
  SPIRType *pSVar13;
  size_type sVar14;
  _Node_iterator_base<unsigned_int,_false> _Var15;
  SPIRVariable *pSVar16;
  SPIRType *pSVar17;
  mapped_type *pmVar18;
  mapped_type *this_00;
  uint7 uVar20;
  undefined8 uVar19;
  TypedID<(spirv_cross::Types)6> *pTVar21;
  long lVar22;
  ulong uVar23;
  ParsedIR *__v;
  CompilerMSL *pCVar24;
  _Base_ptr p_Var25;
  uint32_t arg_idx;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var26;
  uint32_t rvalue_id;
  uint32_t ptr_type_id;
  uint32_t type_id;
  key_type local_108;
  uint32_t func_id_local;
  _Base_ptr local_100;
  TypedID<(spirv_cross::Types)6> *local_f8;
  ParsedIR *local_f0;
  SPIRType *local_e8;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_e0;
  SPIRVariable *local_d8;
  CompilerMSL *local_d0;
  uint32_t base_id;
  undefined4 uStack_c4;
  ulong local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Base_ptr local_a8;
  undefined8 local_a0;
  ulong local_98;
  SPIRFunction *local_90;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_88;
  TypedID<(spirv_cross::Types)6> *local_80;
  key_type local_74;
  string local_70;
  string local_50;
  
  func_id_local = func_id;
  iVar9 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&processed_func_ids->_M_h,&func_id_local);
  if (iVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    local_e0 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)processed_func_ids;
    ::std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)processed_func_ids,&func_id_local);
    local_90 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,func_id_local);
    pTVar21 = (local_90->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
    local_f8 = pTVar21 + (local_90->blocks).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size;
    local_88 = &(this->atomic_image_vars)._M_h;
    local_d8 = (SPIRVariable *)&this->builtin_frag_coord_id;
    local_100 = (_Base_ptr)&this->builtin_layer_id;
    local_f0 = (ParsedIR *)&this->builtin_view_idx_id;
    local_d0 = this;
    while (pTVar21 != local_f8) {
      local_80 = pTVar21;
      pSVar11 = Compiler::get<spirv_cross::SPIRBlock>((Compiler *)this,pTVar21->id);
      pSVar17 = (SPIRType *)(pSVar11->ops).super_VectorView<spirv_cross::Instruction>.ptr;
      local_e8 = (SPIRType *)
                 ((pSVar17->array).stack_storage.aligned_char +
                 (pSVar11->ops).super_VectorView<spirv_cross::Instruction>.buffer_size * 0xc + -0x38
                 );
      for (; pSVar17 != local_e8; pSVar17 = (SPIRType *)&(pSVar17->super_IVariant).field_0xc) {
        puVar12 = Compiler::stream((Compiler *)this,(Instruction *)pSVar17);
        uVar1 = *(uint16_t *)&(pSVar17->super_IVariant)._vptr_IVariant;
        switch(uVar1) {
        case 0x39:
          for (uVar23 = 3; uVar23 < (pSVar17->super_IVariant).self.id; uVar23 = uVar23 + 1) {
            base_id = puVar12[uVar23];
            iVar9 = ::std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&global_var_ids->_M_h,&base_id);
            if (iVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,&base_id);
            }
          }
          local_c0 = local_c0 & 0xffffffff00000000;
          local_b8._M_allocated_capacity = 0;
          local_a0 = 0;
          local_b8._8_8_ = (_Base_ptr)&local_c0;
          local_a8 = (_Base_ptr)&local_c0;
          extract_global_variables_from_function
                    (local_d0,puVar12[2],
                     (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &base_id,global_var_ids,
                     (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_e0);
          ::std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_int>>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)added_arg_ids,(_Rb_tree_const_iterator<unsigned_int>)local_b8._8_8_,
                     (_Base_ptr)&local_c0);
          ::std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&base_id);
          this = local_d0;
          break;
        case 0x3a:
        case 0x3b:
        case 0x3f:
        case 0x40:
          break;
        case 0x3c:
          base_id = puVar12[2];
          pSVar16 = Compiler::maybe_get_backing_variable((Compiler *)this,puVar12[2]);
          if (pSVar16 != (SPIRVariable *)0x0) {
            rvalue_id = (pSVar16->super_IVariant).self.id;
            sVar14 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(local_88,&rvalue_id);
            if (sVar14 != 0) goto LAB_00290e3b;
          }
          break;
        case 0x3d:
        case 0x41:
        case 0x42:
        case 0x43:
        case 0x44:
          base_id = puVar12[2];
          iVar9 = ::std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&global_var_ids->_M_h,&base_id);
          if (iVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)added_arg_ids,&base_id);
          }
          pSVar13 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*puVar12);
          if (((*(int *)&(pSVar13->super_IVariant).field_0xc == 0x10) &&
              ((pSVar13->image).dim == DimSubpassData)) &&
             (((this->msl_options).platform != iOS ||
              ((this->msl_options).ios_use_framebuffer_fetch_subpasses == false)))) {
            if (*(int *)&(local_d8->super_IVariant)._vptr_IVariant == 0) {
              __assert_fail("builtin_frag_coord_id != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x562,
                            "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                           );
            }
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)added_arg_ids,(uint *)local_d8);
            if ((this->msl_options).multiview == true) {
              __v = local_f0;
              if (*(uint32_t *)local_f0 == 0) {
                __assert_fail("builtin_view_idx_id != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                              ,0x567,
                              "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                             );
              }
            }
            else {
              if ((this->msl_options).arrayed_subpass_input != true) break;
              __v = (ParsedIR *)local_100;
              if (local_100->_M_color == 0) {
                __assert_fail("builtin_layer_id != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                              ,0x56d,
                              "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                             );
              }
            }
            goto LAB_00290ea1;
          }
          break;
        case 0x3e:
          base_id = *puVar12;
          iVar9 = ::std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&global_var_ids->_M_h,&base_id);
          if (iVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)added_arg_ids,&base_id);
          }
          rvalue_id = puVar12[1];
          _Var15._M_cur =
               (__node_type *)
               ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&global_var_ids->_M_h,&rvalue_id);
          __v = (ParsedIR *)&rvalue_id;
joined_r0x00290e95:
          if (_Var15._M_cur != (__node_type *)0x0) {
LAB_00290ea1:
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)added_arg_ids,(uint *)__v);
          }
          break;
        default:
          if (uVar1 == 0xa9) {
            base_id = puVar12[3];
            iVar9 = ::std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&global_var_ids->_M_h,&base_id);
            if (iVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,&base_id);
            }
            base_id = puVar12[4];
LAB_00290e3b:
            _Var15._M_cur =
                 (__node_type *)
                 ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&global_var_ids->_M_h,&base_id);
            __v = (ParsedIR *)&base_id;
            goto joined_r0x00290e95;
          }
        }
      }
      pTVar21 = local_80 + 1;
    }
    p_Var10 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,&func_id_local)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(p_Var10,&added_arg_ids->_M_t);
    if (func_id_local != (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
      local_f0 = &(this->super_CompilerGLSL).super_Compiler.ir;
      local_100 = (added_arg_ids->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var26 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&(added_arg_ids->_M_t)._M_impl.super__Rb_tree_header;
      local_e0 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
      local_f8 = (TypedID<(spirv_cross::Types)6> *)0x0;
      local_98 = 0;
      local_88 = p_Var26;
      while ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_100 != p_Var26) {
        rvalue_id = local_100[1]._M_color;
        pSVar16 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,rvalue_id);
        type_id = *(uint32_t *)&(pSVar16->super_IVariant).field_0xc;
        pSVar17 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
        uVar6 = Compiler::get_decoration((Compiler *)this,(ID)rvalue_id,DecorationBuiltIn);
        bVar5 = Compiler::is_tessellation_shader((Compiler *)this);
        if (((((!bVar5) || (pSVar16->storage != StorageClassInput)) &&
             ((EVar7 = Compiler::get_execution_model((Compiler *)this),
              EVar7 != ExecutionModelTessellationControl || (pSVar16->storage != StorageClassOutput)
              ))) || ((bVar5 = Compiler::has_decoration
                                         ((Compiler *)this,(ID)rvalue_id,DecorationPatch), bVar5 ||
                      (bVar5 = is_patch_block(this,pSVar17), bVar5)))) ||
           ((bVar5 = Compiler::is_builtin_variable((Compiler *)this,pSVar16), p_Var25 = local_100,
            bVar5 && (((4 < uVar6 || (uVar6 == 2)) &&
                      (*(int *)&(pSVar17->super_IVariant).field_0xc != 0xf)))))) {
          bVar5 = Compiler::is_builtin_variable((Compiler *)this,pSVar16);
          if ((bVar5) && (*(int *)&(pSVar17->super_IVariant).field_0xc == 0xf)) {
            type_id = Compiler::get_pointee_type_id((Compiler *)this,type_id);
            local_e8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
            local_80 = (TypedID<(spirv_cross::Types)6> *)
                       (local_e8->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
            uVar23 = 0;
            local_d8 = pSVar16;
            for (lVar22 = (local_e8->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                          << 2; pCVar24 = local_d0, this = local_d0, p_Var25 = local_100,
                lVar22 != 0; lVar22 = lVar22 + -4) {
              base_id = 0x7fffffff;
              bVar5 = Compiler::is_member_builtin
                                ((Compiler *)local_d0,local_e8,(uint32_t)uVar23,&base_id);
              if (bVar5) {
                bVar5 = Compiler::has_active_builtin((Compiler *)pCVar24,base_id,pSVar16->storage);
                if (bVar5) {
                  uVar6 = ParsedIR::increase_bound_by(local_f0,2);
                  pTVar21 = local_80;
                  IVar8.id = uVar6 + 1;
                  ptr_type_id = uVar6;
                  pSVar17 = Compiler::get<spirv_cross::SPIRType>
                                      ((Compiler *)pCVar24,local_80[uVar23].id);
                  pSVar17 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                      ((Compiler *)pCVar24,uVar6,pSVar17);
                  uVar6 = pTVar21[uVar23].id;
                  (pSVar17->super_IVariant).self.id = uVar6;
                  pSVar17->storage = local_d8->storage;
                  pSVar17->pointer = true;
                  (pSVar17->parent_type).id = uVar6;
                  SPIRFunction::add_parameter(local_90,(TypeID)pTVar21[uVar23].id,IVar8,true);
                  local_108.id = 7;
                  Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                            ((Compiler *)pCVar24,IVar8.id,&ptr_type_id,&local_108.id);
                  p_Var4 = local_e0;
                  local_108.id = type_id;
                  pmVar18 = ::std::__detail::
                            _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[](local_e0,&local_108);
                  pDVar3 = (pmVar18->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
                  local_74.id = IVar8.id;
                  pmVar18 = ::std::__detail::
                            _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[](p_Var4,&local_74);
                  p_Var26 = local_88;
                  pSVar16 = local_d8;
                  Meta::Decoration::operator=(&pmVar18->decoration,pDVar3 + (uVar23 & 0xffffffff));
                }
              }
              uVar23 = uVar23 + 1;
            }
          }
          else {
            IVar8.id = ParsedIR::increase_bound_by(local_f0,1);
            SPIRFunction::add_parameter(local_90,(TypeID)type_id,IVar8,true);
            base_id = 7;
            ptr_type_id = 0;
            local_e8 = (SPIRType *)CONCAT44(local_e8._4_4_,IVar8.id);
            Compiler::
            set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                      ((Compiler *)this,IVar8.id,&type_id,(StorageClass *)&base_id,
                       (int *)&ptr_type_id,&rvalue_id);
            uVar6 = rvalue_id;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&local_50,this,(ulong)rvalue_id,1);
            pCVar24 = (CompilerMSL *)0x2febb3;
            ::std::__cxx11::string::string((string *)&local_70,"v",(allocator *)&ptr_type_id);
            ensure_valid_name((string *)&base_id,pCVar24,&local_50,&local_70);
            p_Var25 = local_100;
            Compiler::set_name((Compiler *)this,(ID)uVar6,(string *)&base_id);
            ::std::__cxx11::string::~string((string *)&base_id);
            ::std::__cxx11::string::~string((string *)&local_70);
            ::std::__cxx11::string::~string((string *)&local_50);
            p_Var4 = local_e0;
            base_id = rvalue_id;
            pmVar18 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_e0,(key_type *)&base_id);
            ptr_type_id = (uint32_t)local_e8;
            this_00 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](p_Var4,(key_type *)&ptr_type_id);
            Meta::operator=(this_00,pmVar18);
          }
        }
        else {
          _base_id = (pointer)&local_b8;
          local_c0 = 0;
          local_b8._M_allocated_capacity = local_b8._M_allocated_capacity & 0xffffffffffffff00;
          SVar2 = pSVar16->storage;
          uVar20 = (uint7)(uint3)(SVar2 >> 8);
          if (SVar2 == StorageClassInput) {
            if ((local_98 & 1) == 0) {
              uVar19 = ::std::__cxx11::string::assign((char *)&base_id);
              rvalue_id = (this->stage_in_ptr_var_id).id;
              local_98 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
              goto LAB_002913f4;
            }
            local_98 = CONCAT71(uVar20,1);
          }
          else {
            if (SVar2 == StorageClassOutput) {
              if (((ulong)local_f8 & 1) != 0) {
                local_f8 = (TypedID<(spirv_cross::Types)6> *)CONCAT71(uVar20,1);
                goto LAB_00291460;
              }
              uVar19 = ::std::__cxx11::string::assign((char *)&base_id);
              rvalue_id = (this->stage_out_ptr_var_id).id;
              local_f8 = (TypedID<(spirv_cross::Types)6> *)CONCAT71((int7)((ulong)uVar19 >> 8),1);
            }
LAB_002913f4:
            pSVar16 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,rvalue_id);
            type_id = *(uint32_t *)&(pSVar16->super_IVariant).field_0xc;
            IVar8.id = ParsedIR::increase_bound_by(local_f0,1);
            SPIRFunction::add_parameter(local_90,(TypeID)type_id,IVar8,true);
            ptr_type_id = 7;
            local_108.id = 0;
            Compiler::
            set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                      ((Compiler *)this,IVar8.id,&type_id,&ptr_type_id,(int *)&local_108,&rvalue_id)
            ;
            Compiler::set_name((Compiler *)this,IVar8,(string *)&base_id);
          }
LAB_00291460:
          ::std::__cxx11::string::~string((string *)&base_id);
        }
        local_100 = (_Base_ptr)::std::_Rb_tree_increment(p_Var25);
      }
    }
  }
  else {
    p_Var10 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,&func_id_local)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(&added_arg_ids->_M_t,p_Var10);
  }
  return;
}

Assistant:

void CompilerMSL::extract_global_variables_from_function(uint32_t func_id, std::set<uint32_t> &added_arg_ids,
                                                         unordered_set<uint32_t> &global_var_ids,
                                                         unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
	{
		// Return function global variables
		added_arg_ids = function_global_vars[func_id];
		return;
	}

	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);

	// Recursively establish global args added to functions on which we depend.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpArrayLength:
			{
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				// Use Metal's native frame-buffer fetch API for subpass inputs.
				auto &type = get<SPIRType>(ops[0]);
				if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
				    (!msl_options.is_ios() || !msl_options.ios_use_framebuffer_fetch_subpasses))
				{
					// Implicitly reads gl_FragCoord.
					assert(builtin_frag_coord_id != 0);
					added_arg_ids.insert(builtin_frag_coord_id);
					if (msl_options.multiview)
					{
						// Implicitly reads gl_ViewIndex.
						assert(builtin_view_idx_id != 0);
						added_arg_ids.insert(builtin_view_idx_id);
					}
					else if (msl_options.arrayed_subpass_input)
					{
						// Implicitly reads gl_Layer.
						assert(builtin_layer_id != 0);
						added_arg_ids.insert(builtin_layer_id);
					}
				}

				break;
			}

			case OpFunctionCall:
			{
				// First see if any of the function call args are globals
				for (uint32_t arg_idx = 3; arg_idx < i.length; arg_idx++)
				{
					uint32_t arg_id = ops[arg_idx];
					if (global_var_ids.find(arg_id) != global_var_ids.end())
						added_arg_ids.insert(arg_id);
				}

				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				std::set<uint32_t> inner_func_args;
				extract_global_variables_from_function(inner_func_id, inner_func_args, global_var_ids,
				                                       processed_func_ids);
				added_arg_ids.insert(inner_func_args.begin(), inner_func_args.end());
				break;
			}

			case OpStore:
			{
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				uint32_t rvalue_id = ops[1];
				if (global_var_ids.find(rvalue_id) != global_var_ids.end())
					added_arg_ids.insert(rvalue_id);

				break;
			}

			case OpSelect:
			{
				uint32_t base_id = ops[3];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				base_id = ops[4];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			// Emulate texture2D atomic operations
			case OpImageTexelPointer:
			{
				// When using the pointer, we need to know which variable it is actually loaded from.
				uint32_t base_id = ops[2];
				auto *var = maybe_get_backing_variable(base_id);
				if (var && atomic_image_vars.count(var->self))
				{
					if (global_var_ids.find(base_id) != global_var_ids.end())
						added_arg_ids.insert(base_id);
				}
				break;
			}

			default:
				break;
			}

			// TODO: Add all other operations which can affect memory.
			// We should consider a more unified system here to reduce boiler-plate.
			// This kind of analysis is done in several places ...
		}
	}

	function_global_vars[func_id] = added_arg_ids;

	// Add the global variables as arguments to the function
	if (func_id != ir.default_entry_point)
	{
		bool added_in = false;
		bool added_out = false;
		for (uint32_t arg_id : added_arg_ids)
		{
			auto &var = get<SPIRVariable>(arg_id);
			uint32_t type_id = var.basetype;
			auto *p_type = &get<SPIRType>(type_id);
			BuiltIn bi_type = BuiltIn(get_decoration(arg_id, DecorationBuiltIn));

			if (((is_tessellation_shader() && var.storage == StorageClassInput) ||
			     (get_execution_model() == ExecutionModelTessellationControl && var.storage == StorageClassOutput)) &&
			    !(has_decoration(arg_id, DecorationPatch) || is_patch_block(*p_type)) &&
			    (!is_builtin_variable(var) || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
			     bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
			     p_type->basetype == SPIRType::Struct))
			{
				// Tessellation control shaders see inputs and per-vertex outputs as arrays.
				// Similarly, tessellation evaluation shaders see per-vertex inputs as arrays.
				// We collected them into a structure; we must pass the array of this
				// structure to the function.
				std::string name;
				if (var.storage == StorageClassInput)
				{
					if (added_in)
						continue;
					name = "gl_in";
					arg_id = stage_in_ptr_var_id;
					added_in = true;
				}
				else if (var.storage == StorageClassOutput)
				{
					if (added_out)
						continue;
					name = "gl_out";
					arg_id = stage_out_ptr_var_id;
					added_out = true;
				}
				type_id = get<SPIRVariable>(arg_id).basetype;
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				set_name(next_id, name);
			}
			else if (is_builtin_variable(var) && p_type->basetype == SPIRType::Struct)
			{
				// Get the pointee type
				type_id = get_pointee_type_id(type_id);
				p_type = &get<SPIRType>(type_id);

				uint32_t mbr_idx = 0;
				for (auto &mbr_type_id : p_type->member_types)
				{
					BuiltIn builtin = BuiltInMax;
					bool is_builtin = is_member_builtin(*p_type, mbr_idx, &builtin);
					if (is_builtin && has_active_builtin(builtin, var.storage))
					{
						// Add a arg variable with the same type and decorations as the member
						uint32_t next_ids = ir.increase_bound_by(2);
						uint32_t ptr_type_id = next_ids + 0;
						uint32_t var_id = next_ids + 1;

						// Make sure we have an actual pointer type,
						// so that we will get the appropriate address space when declaring these builtins.
						auto &ptr = set<SPIRType>(ptr_type_id, get<SPIRType>(mbr_type_id));
						ptr.self = mbr_type_id;
						ptr.storage = var.storage;
						ptr.pointer = true;
						ptr.parent_type = mbr_type_id;

						func.add_parameter(mbr_type_id, var_id, true);
						set<SPIRVariable>(var_id, ptr_type_id, StorageClassFunction);
						ir.meta[var_id].decoration = ir.meta[type_id].members[mbr_idx];
					}
					mbr_idx++;
				}
			}
			else
			{
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				// Ensure the existing variable has a valid name and the new variable has all the same meta info
				set_name(arg_id, ensure_valid_name(to_name(arg_id), "v"));
				ir.meta[next_id] = ir.meta[arg_id];
			}
		}
	}
}